

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrPlaneDetectorLocationsEXT *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  ulong uVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  long lVar4;
  allocator local_161;
  GenValidUsageXrInstanceInfo *local_160;
  string *local_158;
  allocator local_149;
  string local_148;
  string error_message;
  string local_108;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar2 = XR_SUCCESS;
  local_160 = instance_info;
  local_158 = command_name;
  if (value->type != XR_TYPE_PLANE_DETECTOR_LOCATIONS_EXT) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrPlaneDetectorLocationsEXT",value->type,
               "VUID-XrPlaneDetectorLocationsEXT-type-type",XR_TYPE_PLANE_DETECTOR_LOCATIONS_EXT,
               "XR_TYPE_PLANE_DETECTOR_LOCATIONS_EXT");
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    NVar1 = ValidateNextChain(local_160,local_158,objects_info,value->next,&valid_ext_structs,
                              &encountered_structs,&duplicate_ext_structs);
    if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)&local_148);
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_148,local_160,&duplicate_ext_structs);
      std::__cxx11::string::append((string *)&error_message);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::string
                ((string *)&local_148,"VUID-XrPlaneDetectorLocationsEXT-next-unique",&local_161);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_78,objects_info);
      std::__cxx11::string::string
                ((string *)&local_108,
                 "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorLocationsEXT struct"
                 ,&local_149);
      CoreValidLogMessage(local_160,&local_148,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_158,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_78,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_78);
      std::__cxx11::string::~string((string *)&local_148);
LAB_001b28c9:
      std::__cxx11::string::~string((string *)&error_message);
      XVar2 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrPlaneDetectorLocationsEXT-next-next",
                 (allocator *)&local_108);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_60,objects_info);
      std::__cxx11::string::string
                ((string *)&local_148,
                 "Invalid structure(s) in \"next\" chain for XrPlaneDetectorLocationsEXT struct \"next\""
                 ,&local_161);
      CoreValidLogMessage(local_160,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_158,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_60,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_60);
      goto LAB_001b28c9;
    }
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  }
  if (!check_members || XVar2 != XR_SUCCESS) {
    return XVar2;
  }
  if (value->planeLocationCapacityInput == 0) {
    if (value->planeLocations == (XrPlaneDetectorLocationEXT *)0x0) {
      return XR_SUCCESS;
    }
  }
  else if (value->planeLocations == (XrPlaneDetectorLocationEXT *)0x0) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrPlaneDetectorLocationsEXT-planeLocations-parameter",
               (allocator *)&local_108);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_90,objects_info);
    std::__cxx11::string::string
              ((string *)&local_148,
               "Structure XrPlaneDetectorLocationsEXT member planeLocationCapacityInput is NULL, but value->planeLocationCapacityInput is greater than 0"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(local_160,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_158,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_90,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    this = &local_90;
    goto LAB_001b2a65;
  }
  uVar3 = 0xffffffffffffffff;
  lVar4 = 0;
  do {
    uVar3 = uVar3 + 1;
    if (value->planeLocationCapacityInput <= uVar3) {
      return XR_SUCCESS;
    }
    XVar2 = ValidateXrStruct(local_160,local_158,objects_info,true,true,
                             (XrPlaneDetectorLocationEXT *)
                             ((long)&value->planeLocations->type + lVar4));
    lVar4 = lVar4 + 0x50;
  } while (XVar2 == XR_SUCCESS);
  std::__cxx11::string::string
            ((string *)&error_message,"VUID-XrPlaneDetectorLocationsEXT-planeLocations-parameter",
             (allocator *)&local_108);
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             &local_a8,objects_info);
  std::__cxx11::string::string
            ((string *)&local_148,
             "Structure XrPlaneDetectorLocationsEXT member planeLocations is invalid",
             (allocator *)&valid_ext_structs);
  CoreValidLogMessage(local_160,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_158,
                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                       *)&local_a8,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  this = &local_a8;
LAB_001b2a65:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrPlaneDetectorLocationsEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_PLANE_DETECTOR_LOCATIONS_EXT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrPlaneDetectorLocationsEXT",
                             value->type, "VUID-XrPlaneDetectorLocationsEXT-type-type", XR_TYPE_PLANE_DETECTOR_LOCATIONS_EXT, "XR_TYPE_PLANE_DETECTOR_LOCATIONS_EXT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationsEXT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrPlaneDetectorLocationsEXT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrPlaneDetectorLocationsEXT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationsEXT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorLocationsEXT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->planeLocationCapacityInput is non-zero
    if (0 != value->planeLocationCapacityInput && nullptr == value->planeLocations) {
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationsEXT-planeLocations-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrPlaneDetectorLocationsEXT member planeLocationCapacityInput is NULL, but value->planeLocationCapacityInput is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->planeLocations) {
        for (uint32_t value_planelocations_inc = 0; value_planelocations_inc < value->planeLocationCapacityInput; ++value_planelocations_inc) {
            // Validate that the structure XrPlaneDetectorLocationEXT is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->planeLocations[value_planelocations_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationsEXT-planeLocations-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrPlaneDetectorLocationsEXT member planeLocations is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}